

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::compareName<flatbuffers::EnumDef>(EnumDef *a,EnumDef *b)

{
  bool bVar1;
  string local_58;
  string local_38;
  EnumDef *local_18;
  EnumDef *b_local;
  EnumDef *a_local;
  
  local_18 = b;
  b_local = a;
  Namespace::GetFullyQualifiedName
            (&local_38,(a->super_Definition).defined_namespace,(string *)a,1000);
  Namespace::GetFullyQualifiedName
            (&local_58,(local_18->super_Definition).defined_namespace,(string *)local_18,1000);
  bVar1 = std::operator<(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

static bool compareName(const T *a, const T *b) {
  return a->defined_namespace->GetFullyQualifiedName(a->name) <
         b->defined_namespace->GetFullyQualifiedName(b->name);
}